

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::auxIsTree(Graph *this,Vertex *v,int *markeds,bool *isCycle)

{
  ostream *poVar1;
  Edge **ppEVar2;
  Edge *pEVar3;
  
  if (v == (Vertex *)0x0) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\n No NULL \n");
    std::endl<char,std::char_traits<char>>(poVar1);
    return;
  }
  if (v->marked == false) {
    v->marked = true;
    *markeds = *markeds + 1;
    ppEVar2 = &v->edgesList;
    while (pEVar3 = *ppEVar2, pEVar3 != (Edge *)0x0) {
      while( true ) {
        if (pEVar3 == (Edge *)0x0) {
          return;
        }
        if (pEVar3->closed != false) break;
        pEVar3 = pEVar3->nextEdge;
      }
      auxIsTree(this,pEVar3->destiny,markeds,isCycle);
      ppEVar2 = &pEVar3->nextEdge;
    }
  }
  else {
    *isCycle = true;
  }
  return;
}

Assistant:

void Graph::auxIsTree(Vertex *v, int &markeds, bool &isCycle){
    if(v == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        if(v->getMarked() == false){
            v->setMarked(true);
            markeds++;

            for(Edge *a= v->getEdgesList(); a!=NULL; a= a->getNext()){

                //nao descer por arcos com chave aberta
                while(a!=NULL && a->isClosed() == false){
                    a = a->getNext();
                }

                if(a==NULL)
                    break;

                auxIsTree(a->getDestiny(), markeds, isCycle);
            }
        }
        else
            isCycle = true;
    }
}